

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

JoinerInfo * __thiscall
ot::commissioner::CommissionerApp::GetJoinerInfo
          (CommissionerApp *this,JoinerType aType,ByteArray *aJoinerId)

{
  iterator iVar1;
  iterator iVar2;
  JoinerInfo *pJVar3;
  key_type local_48;
  
  local_48.mType = aType;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_48.mId,aJoinerId);
  iVar1 = std::
          _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,_std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>,_std::_Select1st<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
          ::find(&(this->mJoiners)._M_t,&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_48.mId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->mJoiners)._M_t._M_impl.super__Rb_tree_header) {
    local_48.mType = aType;
    Commissioner::ComputeJoinerId(&local_48.mId,0);
    iVar2 = std::
            _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,_std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>,_std::_Select1st<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
            ::find(&(this->mJoiners)._M_t,&local_48);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_48.mId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    pJVar3 = (JoinerInfo *)0x0;
    if (iVar2._M_node != iVar1._M_node) {
      pJVar3 = (JoinerInfo *)(iVar2._M_node + 2);
    }
  }
  else {
    pJVar3 = (JoinerInfo *)(iVar1._M_node + 2);
  }
  return pJVar3;
}

Assistant:

const JoinerInfo *CommissionerApp::GetJoinerInfo(JoinerType aType, const ByteArray &aJoinerId)
{
    auto joinerInfo = mJoiners.find({aType, aJoinerId});
    if (joinerInfo != mJoiners.end())
    {
        return &joinerInfo->second;
    }
    joinerInfo = mJoiners.find({aType, Commissioner::ComputeJoinerId(0)});
    if (joinerInfo != mJoiners.end())
    {
        return &joinerInfo->second;
    }
    return nullptr;
}